

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallImportedRuntimeArtifactsGenerator *this,
          string *config)

{
  string *config_00;
  cmLocalGenerator *lg;
  string local_70;
  string local_40;
  string *local_20;
  string *config_local;
  cmInstallImportedRuntimeArtifactsGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmInstallImportedRuntimeArtifactsGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)&local_40,(string *)&(this->super_cmInstallGenerator).Destination);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  config_00 = local_20;
  std::__cxx11::string::string((string *)&local_70);
  cmGeneratorExpression::Evaluate
            (__return_storage_ptr__,&local_40,lg,config_00,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallImportedRuntimeArtifactsGenerator::GetDestination(
  std::string const& config) const
{
  return cmGeneratorExpression::Evaluate(
    this->Destination, this->Target->GetLocalGenerator(), config);
}